

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O0

LocalizedNumberFormatter * __thiscall
icu_63::number::NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>::adoptPerUnit
          (LocalizedNumberFormatter *__return_storage_ptr__,
          NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter> *this,
          MeasureUnit *perUnit)

{
  MeasureUnit *perUnit_local;
  NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter> *this_local;
  LocalizedNumberFormatter *copy;
  
  LocalizedNumberFormatter::LocalizedNumberFormatter(__return_storage_ptr__,this);
  if ((perUnit != (MeasureUnit *)0x0) &&
     (MeasureUnit::operator=
                (&(__return_storage_ptr__->
                  super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
                  perUnit,perUnit), perUnit != (MeasureUnit *)0x0)) {
    (*(perUnit->super_UObject)._vptr_UObject[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

Derived NumberFormatterSettings<Derived>::adoptPerUnit(icu::MeasureUnit* perUnit) const& {
    Derived copy(*this);
    // See comments above about slicing and ownership.
    if (perUnit != nullptr) {
        // TODO: On nullptr, reset to default value?
        copy.fMacros.perUnit = std::move(*perUnit);
        delete perUnit;
    }
    return copy;
}